

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::detail::generic_type::def_property_static_impl
          (generic_type *this,char *name,handle fget,handle fset,function_record *rec_func)

{
  internals *piVar1;
  long *plVar2;
  long lVar3;
  char cVar4;
  char *c;
  handle property;
  object local_a0;
  object local_98;
  handle local_90;
  object local_88;
  object local_80;
  generic_type *local_78;
  char *local_70;
  handle local_68;
  handle local_60;
  handle local_58 [2];
  PyObject *local_48;
  char *local_40;
  object local_38;
  
  local_78 = this;
  local_70 = name;
  if (rec_func == (function_record *)0x0) {
    local_58[0].m_ptr = (PyObject *)&PyProperty_Type;
    cVar4 = '\0';
  }
  else {
    cVar4 = options::global_state()::instance;
    if ((rec_func->field_0x59 & 0x10) == 0) {
      if (rec_func->doc == (char *)0x0) {
        cVar4 = '\0';
      }
    }
    else {
      if (rec_func->doc == (char *)0x0) {
        cVar4 = '\0';
      }
      if ((rec_func->scope).m_ptr != (PyObject *)0x0) {
        local_58[0].m_ptr = (PyObject *)&PyProperty_Type;
        goto LAB_0013201b;
      }
    }
    piVar1 = get_internals();
    local_58[0].m_ptr = (PyObject *)piVar1->static_property_type;
  }
LAB_0013201b:
  lVar3 = __Py_NoneStruct;
  local_60.m_ptr = fget.m_ptr;
  if (fget.m_ptr == (PyObject *)0x0) {
    local_80.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    plVar2 = (long *)__tls_get_addr(&PTR_0019ddc0);
    *plVar2 = *plVar2 + 1;
    __Py_NoneStruct = lVar3 + 1;
    local_60.m_ptr = (PyObject *)&_Py_NoneStruct;
  }
  lVar3 = __Py_NoneStruct;
  if (fset.m_ptr == (PyObject *)0x0) {
    local_88.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    plVar2 = (long *)__tls_get_addr(&PTR_0019ddc0);
    *plVar2 = *plVar2 + 1;
    lVar3 = lVar3 + 1;
    local_68.m_ptr = (PyObject *)&_Py_NoneStruct;
  }
  else {
    plVar2 = (long *)__tls_get_addr(&PTR_0019ddc0);
    local_68.m_ptr = fset.m_ptr;
  }
  *plVar2 = *plVar2 + 1;
  local_98.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = lVar3 + 1;
  if (cVar4 == '\0') {
    c = "";
  }
  else {
    c = rec_func->doc;
  }
  str::str((str *)&local_a0,c);
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_90,local_58,&local_60,(none *)&local_68,
             (str *)&local_98);
  local_48 = (local_78->super_object).super_handle.m_ptr;
  local_40 = local_70;
  local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor_policies::str_attr::set((handle)local_48,local_70,local_90);
  object::~object(&local_38);
  object::~object((object *)&local_90);
  object::~object(&local_a0);
  object::~object(&local_98);
  if (fset.m_ptr == (PyObject *)0x0) {
    object::~object(&local_88);
  }
  if (fget.m_ptr == (PyObject *)0x0) {
    object::~object(&local_80);
  }
  return;
}

Assistant:

void def_property_static_impl(const char *name,
                                  handle fget,
                                  handle fset,
                                  detail::function_record *rec_func) {
        const auto is_static = (rec_func != nullptr) && !(rec_func->is_method && rec_func->scope);
        const auto has_doc = (rec_func != nullptr) && (rec_func->doc != nullptr)
                             && pybind11::options::show_user_defined_docstrings();
        auto property = handle(
            (PyObject *) (is_static ? get_internals().static_property_type : &PyProperty_Type));
        attr(name) = property(fget.ptr() ? fget : none(),
                              fset.ptr() ? fset : none(),
                              /*deleter*/ none(),
                              pybind11::str(has_doc ? rec_func->doc : ""));
    }